

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32 uVar1;
  long lVar2;
  long lVar3;
  vector_t pfVar4;
  int iVar5;
  int32 iVar6;
  cmd_ln_t *pcVar7;
  char *pcVar8;
  FILE *pFVar9;
  void *pvVar10;
  ulong uVar11;
  void ****ppppvVar12;
  void *pvVar13;
  float32 ***mixw;
  size_t sVar14;
  node *sroot;
  int32 **ppiVar15;
  int32 *piVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int32 *piVar21;
  uint uVar22;
  ulong uVar23;
  int32 *piVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  vector_t **pppfVar28;
  size_t sVar29;
  uint32 *puVar30;
  double dVar31;
  double dVar32;
  float fVar33;
  float fVar34;
  uint32 n_density;
  uint32 n_stream;
  uint32 t_ndensity;
  int32 **local_138;
  int32 **local_130;
  float32 **local_128;
  int local_120;
  uint32 t_nfeat;
  ulong local_118;
  float32 **local_110;
  uint32 local_104;
  void *local_100;
  void *local_f8;
  void *local_f0;
  ulong local_e8;
  uint32 *l_veclen;
  model_def_t *mdef;
  uint32 t_nstates;
  ulong local_c8;
  uint32 *local_c0;
  int32 *local_b8;
  ulong local_b0;
  char *local_a8;
  uint32 *local_a0;
  vector_t ****local_98;
  vector_t ***fullvar;
  vector_t ***fullmean;
  uint32 *t_veclen;
  uint32 l_nstates;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  float32 ***in_mixw;
  uint32 n_in_mixw;
  
  parse_cmd_ln(argc,argv);
  pcVar7 = cmd_ln_get();
  pcVar8 = cmd_ln_str_r(pcVar7,"-type");
  if (pcVar8 != (char *)0x0) {
    local_120 = strcmp(pcVar8,".cont.");
    if (local_120 == 0) {
      local_70 = 1;
LAB_001046bc:
      pcVar7 = cmd_ln_get();
      pcVar8 = cmd_ln_str_r(pcVar7,"-questfn");
      pcVar7 = cmd_ln_get();
      local_48 = cmd_ln_int_r(pcVar7,"-npermute");
      pcVar7 = cmd_ln_get();
      local_50 = cmd_ln_int_r(pcVar7,"-qstperstt");
      local_a8 = pcVar8;
      pFVar9 = fopen(pcVar8,"w");
      if (pFVar9 != (FILE *)0x0) {
        fwrite("WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n",0x36,1,pFVar9);
        fclose(pFVar9);
        fullmean = (vector_t ***)0x0;
        fullvar = (vector_t ***)0x0;
        local_98 = (vector_t ****)0x0;
        pcVar7 = cmd_ln_get();
        pcVar8 = cmd_ln_str_r(pcVar7,"-moddeffn");
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "Specify -moddeffn\n";
          lVar19 = 0x316;
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                  ,0x318,"Reading: %s\n",pcVar8);
          iVar6 = model_def_read(&mdef,pcVar8);
          if (iVar6 == 0) {
            uVar25 = mdef->acmod_set->n_ci;
            uVar18 = (ulong)uVar25;
            local_f0 = __ckd_calloc_2d__(uVar18,100,1,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x31e);
            for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
              pcVar8 = *(char **)((long)local_f0 + uVar23 * 8);
              pcVar17 = acmod_set_id2name(mdef->acmod_set,(acmod_id_t)uVar23);
              strcpy(pcVar8,pcVar17);
            }
            local_128 = (float32 **)CONCAT44(local_128._4_4_,*mdef->defn->state);
            pcVar7 = cmd_ln_get();
            pcVar8 = cmd_ln_str_r(pcVar7,"-mixwfn");
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "Specify -mixwfn\n";
              lVar19 = 0x329;
              goto LAB_001048f8;
            }
            uVar22 = 1;
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                    ,0x32b,"Reading: %s\n",pcVar8);
            iVar5 = s3mixw_read(pcVar8,&in_mixw,&n_in_mixw,&n_stream,&n_density);
            if (iVar5 == 0) {
              uVar25 = uVar25 - 1;
              uVar1 = mdef->defn->n_state;
              uVar23 = (ulong)(uVar1 - 1);
              local_e8 = (ulong)n_stream;
              local_104 = n_density;
LAB_001048d0:
              local_c8 = uVar23;
              if (uVar22 <= uVar25) goto code_r0x001048d4;
              pvVar10 = __ckd_calloc_2d__(uVar18,uVar23,8,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                          ,0x347);
              for (uVar11 = 0; uVar11 != uVar18; uVar11 = uVar11 + 1) {
                for (uVar20 = 0; uVar23 != uVar20; uVar20 = uVar20 + 1) {
                  *(float32 ***)(*(long *)((long)pvVar10 + uVar11 * 8) + uVar20 * 8) =
                       in_mixw[mdef->defn[uVar11].state[uVar20] - (uint)local_128];
                }
              }
              local_118 = uVar18;
              if (local_120 != 0) {
                ppppvVar12 = __ckd_calloc_4d__(uVar18,uVar23,(ulong)n_stream,(ulong)n_density,4,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                               ,0x3c4);
                local_b0 = 0;
                local_130 = (int32 **)((ulong)local_130 & 0xffffffff00000000);
                for (uVar11 = 0; uVar11 != uVar18; uVar11 = uVar11 + 1) {
                  pcVar8 = *(char **)((long)local_f0 + uVar11 * 8);
                  pcVar17 = strchr(pcVar8,0x2b);
                  if ((pcVar17 == (char *)0x0) && (iVar5 = strcmp(pcVar8,"SIL"), iVar5 != 0)) {
                    uVar20 = (ulong)local_130 & 0xffffffff;
                    strcpy(*(char **)((long)local_f0 + uVar20 * 8),pcVar8);
                    for (uVar18 = 0; uVar18 != uVar23; uVar18 = uVar18 + 1) {
                      for (uVar26 = 0; uVar26 != n_stream; uVar26 = uVar26 + 1) {
                        for (uVar27 = 0; n_density != uVar27; uVar27 = uVar27 + 1) {
                          *(undefined4 *)((long)ppppvVar12[uVar20][uVar18][uVar26] + uVar27 * 4) =
                               *(undefined4 *)
                                (*(long *)(*(long *)(*(long *)((long)pvVar10 + uVar11 * 8) +
                                                    uVar18 * 8) + uVar26 * 8) + uVar27 * 4);
                        }
                      }
                    }
                    local_130 = (int32 **)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                  }
                  uVar18 = local_118;
                }
                local_f8 = (void *)0x0;
                local_100 = (void *)0x0;
                goto LAB_00105040;
              }
              pcVar7 = cmd_ln_get();
              lVar19 = cmd_ln_int_r(pcVar7,"-fullvar");
              pcVar7 = cmd_ln_get();
              pcVar8 = cmd_ln_str_r(pcVar7,"-meanfn");
              iVar5 = s3gau_read(pcVar8,&fullmean,&l_nstates,&t_nfeat,&t_ndensity,&l_veclen);
              if (iVar5 != 0) {
                pcVar7 = cmd_ln_get();
                pcVar8 = cmd_ln_str_r(pcVar7,"-meanfn");
                pcVar17 = "Error reading mean file %s\n";
                lVar19 = 0x35d;
                goto LAB_001056c0;
              }
              local_b0 = (ulong)*l_veclen;
              if ((t_nfeat != n_stream) && (t_ndensity != n_density)) {
                pcVar8 = "Mismatch between Mean and Mixture weight files\n";
                lVar19 = 0x360;
                goto LAB_001048f8;
              }
              pcVar7 = cmd_ln_get();
              pcVar8 = cmd_ln_str_r(pcVar7,"-varfn");
              if ((int)lVar19 != 0) {
                iVar5 = s3gau_read_full(pcVar8,&local_98,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
                if (iVar5 != 0) {
                  pcVar7 = cmd_ln_get();
                  pcVar8 = cmd_ln_str_r(pcVar7,"-varfn");
                  pcVar17 = "Error reading var file %s\n";
                  lVar19 = 0x369;
                  goto LAB_001056c0;
                }
LAB_00104bcb:
                uVar11 = (ulong)n_stream;
                if ((t_nfeat != n_stream) && (t_ndensity != n_density)) {
                  pcVar8 = "Mismatch between Variance and Mixture weight files\n";
                  lVar19 = 0x375;
                  goto LAB_001048f8;
                }
                uVar20 = 0;
                do {
                  if (uVar11 == uVar20) {
                    if (l_nstates == t_nstates) {
                      if (t_nfeat < 2) {
                        if (1 < t_ndensity) {
                          err_msg(ERR_WARN,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                  ,0x37f,
                                  "The state distributions given have %d gaussians per state;\n..*..shrinking them down to 1 gau per state..\n"
                                 );
                          uVar11 = (ulong)n_stream;
                        }
                        uVar22 = 0;
                        for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
                          uVar22 = uVar22 + t_veclen[uVar20];
                        }
                        local_e8 = CONCAT44(local_e8._4_4_,uVar25);
                        local_f8 = __ckd_calloc_3d__(uVar18,uVar23,(ulong)uVar22,4,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x385);
                        pvVar13 = __ckd_calloc_3d__(uVar18,uVar23,(ulong)uVar22,4,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x387);
                        ppppvVar12 = __ckd_calloc_4d__(uVar18,uVar23,1,1,4,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x388);
                        pcVar7 = cmd_ln_get();
                        dVar31 = cmd_ln_float_r(pcVar7,"-varfloor");
                        ppiVar15 = (int32 **)0x0;
                        uVar25 = (uint)local_128;
                        while( true ) {
                          local_110 = (float32 **)pvVar10;
                          local_100 = pvVar13;
                          if ((uint)local_e8 < (uint)ppiVar15) break;
                          local_b8 = (int32 *)(ulong)n_density;
                          local_a0 = l_veclen;
                          for (uVar18 = 0; local_138 = ppiVar15, local_130 = ppiVar15,
                              uVar18 != uVar23; uVar18 = uVar18 + 1) {
                            lVar2 = *(long *)(*(long *)((long)local_f8 + (long)ppiVar15 * 8) +
                                             uVar18 * 8);
                            lVar3 = *(long *)(*(long *)((long)pvVar13 + (long)ppiVar15 * 8) +
                                             uVar18 * 8);
                            local_c0 = l_veclen;
                            local_128 = (float32 **)CONCAT44(local_128._4_4_,uVar25);
                            dVar32 = 0.0;
                            for (piVar16 = (int32 *)0x0; piVar16 != local_b8;
                                piVar16 = (int32 *)((long)piVar16 + 1)) {
                              fVar33 = *(float *)(**(long **)(*(long *)((long)pvVar10 +
                                                                       (long)ppiVar15 * 8) +
                                                             uVar18 * 8) + (long)piVar16 * 4);
                              uVar22 = *l_veclen;
                              for (piVar21 = (int32 *)0x0; (int32 *)(ulong)uVar22 != piVar21;
                                  piVar21 = (int32 *)((long)piVar21 + 1)) {
                                pfVar4 = (*fullmean[uVar25])[(long)piVar16];
                                *(float *)(lVar2 + (long)piVar21 * 4) =
                                     pfVar4[(long)piVar21] * fVar33 +
                                     *(float *)(lVar2 + (long)piVar21 * 4);
                                if ((int)lVar19 == 0) {
                                  pppfVar28 = fullvar[uVar25];
                                  piVar24 = piVar16;
                                }
                                else {
                                  pppfVar28 = *local_98[uVar25] + (long)piVar16;
                                  piVar24 = piVar21;
                                }
                                fVar34 = pfVar4[(long)piVar21];
                                *(float *)(lVar3 + (long)piVar21 * 4) =
                                     (fVar34 * fVar34 + (*pppfVar28)[(long)piVar24][(long)piVar21])
                                     * fVar33 + *(float *)(lVar3 + (long)piVar21 * 4);
                              }
                              dVar32 = dVar32 + (double)fVar33;
                            }
                            uVar22 = *l_veclen;
                            if ((dVar32 != 0.0) || (NAN(dVar32))) {
                              for (uVar11 = 0; uVar22 != uVar11; uVar11 = uVar11 + 1) {
                                fVar33 = (float)((double)*(float *)(lVar2 + uVar11 * 4) / dVar32);
                                *(float *)(lVar2 + uVar11 * 4) = fVar33;
                                fVar34 = (float)((double)*(float *)(lVar3 + uVar11 * 4) / dVar32 -
                                                (double)(fVar33 * fVar33));
                                fVar33 = (float)dVar31;
                                if ((float)dVar31 <= fVar34) {
                                  fVar33 = fVar34;
                                }
                                *(float *)(lVar3 + uVar11 * 4) = fVar33;
                              }
                            }
                            else {
                              uVar11 = 0;
                              while (uVar22 != uVar11) {
                                fVar33 = *(float *)(lVar2 + uVar11 * 4);
                                uVar11 = uVar11 + 1;
                                if ((fVar33 != 0.0) || (NAN(fVar33))) {
                                  err_msg(ERR_FATAL,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                          ,0x3aa,
                                          "dnom = 0, but featmean[nn] != 0, =  %f for ll = %d\n",
                                          (double)fVar33,0);
                                  goto LAB_00105526;
                                }
                              }
                            }
                            *(float *)*ppppvVar12[(long)ppiVar15][uVar18] = (float)dVar32;
                            uVar25 = uVar25 + 1;
                          }
                          ppiVar15 = (int32 **)(ulong)((uint)ppiVar15 + 1);
                        }
                        local_e8 = 1;
                        local_130 = (int32 **)((ulong)local_130 & 0xffffffff00000000);
                        for (uVar18 = 0; uVar18 != local_118; uVar18 = uVar18 + 1) {
                          pcVar8 = *(char **)((long)local_f0 + uVar18 * 8);
                          pcVar17 = strchr(pcVar8,0x2b);
                          if ((pcVar17 == (char *)0x0) && (iVar5 = strcmp(pcVar8,"SIL"), iVar5 != 0)
                             ) {
                            uVar20 = (ulong)local_130 & 0xffffffff;
                            strcpy(*(char **)((long)local_f0 + uVar20 * 8),pcVar8);
                            for (uVar11 = 0; uVar11 != uVar23; uVar11 = uVar11 + 1) {
                              *(undefined4 *)*ppppvVar12[uVar20][uVar11] =
                                   **ppppvVar12[uVar18][uVar11];
                              uVar25 = *l_veclen;
                              for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                                *(undefined4 *)
                                 (*(long *)(*(long *)((long)local_f8 + uVar20 * 8) + uVar11 * 8) +
                                 uVar26 * 4) = *(undefined4 *)
                                                (*(long *)(*(long *)((long)local_f8 + uVar18 * 8) +
                                                          uVar11 * 8) + uVar26 * 4);
                                *(undefined4 *)
                                 (*(long *)(*(long *)((long)local_100 + uVar20 * 8) + uVar11 * 8) +
                                 uVar26 * 4) = *(undefined4 *)
                                                (*(long *)(*(long *)((long)local_100 + uVar18 * 8) +
                                                          uVar11 * 8) + uVar26 * 4);
                              }
                            }
                            local_130 = (int32 **)CONCAT44(local_130._4_4_,(int)local_130 + 1);
                          }
                        }
                        local_104 = 1;
LAB_00105040:
                        if (local_120 == 0) {
                          ckd_free_4d(fullmean);
                          if (fullvar != (vector_t ***)0x0) {
                            ckd_free_4d(fullvar);
                          }
                          if (local_98 != (vector_t ****)0x0) {
                            gauden_free_param_full(local_98);
                          }
                        }
                        uVar18 = (ulong)local_130 & 0xffffffff;
                        local_118 = local_e8 & 0xffffffff;
                        uVar11 = (ulong)local_104;
                        local_68 = local_b0 & 0xffffffff;
                        local_60 = (ulong)((int)local_130 * (uint)local_c8);
                        local_c8 = (ulong)((uint)local_c8 >> 1);
                        uVar20 = 0;
                        local_128 = (float32 **)0x0;
                        local_110 = (float32 **)0x0;
                        local_58 = uVar18;
                        do {
                          if (uVar20 == uVar23) {
                            err_msg(ERR_INFO,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x45b,"Stored questions in %s\n",local_a8);
                            return 0;
                          }
                          local_138 = (int32 **)
                                      __ckd_calloc__(uVar18,4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x425);
                          __ckd_calloc__(1,0x30,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x426);
                          mixw = (float32 ***)
                                 __ckd_calloc_3d__(uVar18,local_118,uVar11,4,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x428);
                          uVar26 = local_68;
                          if (local_120 == 0) {
                            local_110 = (float32 **)
                                        __ckd_calloc_2d__(uVar18,local_68,4,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x42a);
                            local_128 = (float32 **)
                                        __ckd_calloc_2d__(uVar18,uVar26,4,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x42b);
                            for (sVar14 = 0; sVar14 != uVar18; sVar14 = sVar14 + 1) {
                              *(int32 *)((long)local_138 + sVar14 * 4) = (int32)sVar14;
                              **mixw[sVar14] = **ppppvVar12[sVar14][uVar20];
                              for (sVar29 = 0; uVar26 != sVar29; sVar29 = sVar29 + 1) {
                                local_110[sVar14][sVar29] =
                                     *(float32 *)
                                      (*(long *)(*(long *)((long)local_f8 + sVar14 * 8) + uVar20 * 8
                                                ) + sVar29 * 4);
                                local_128[sVar14][sVar29] =
                                     *(float32 *)
                                      (*(long *)(*(long *)((long)local_100 + sVar14 * 8) +
                                                uVar20 * 8) + sVar29 * 4);
                              }
                            }
                          }
                          else {
                            for (sVar14 = 0; sVar14 != uVar18; sVar14 = sVar14 + 1) {
                              *(int32 *)((long)local_138 + sVar14 * 4) = (int32)sVar14;
                              for (uVar26 = 0; uVar26 != local_118; uVar26 = uVar26 + 1) {
                                for (uVar27 = 0; uVar11 != uVar27; uVar27 = uVar27 + 1) {
                                  mixw[sVar14][uVar26][uVar27] =
                                       *(float32 *)
                                        ((long)ppppvVar12[sVar14][uVar20][uVar26] + uVar27 * 4);
                                }
                              }
                            }
                          }
                          ppiVar15 = local_138;
                          sroot = make_tree(local_110,local_128,mixw,(int32 *)local_138,
                                            (int)local_130,local_104,(int32)local_e8,(int32)local_b0
                                            ,(int32)local_48,0,(int32)local_70);
                          if (local_120 == 0) {
                            ckd_free_2d(local_110);
                            ckd_free_2d(local_128);
                          }
                          ckd_free_3d(mixw);
                          ckd_free(ppiVar15);
                          uVar18 = local_60;
                          ppiVar15 = (int32 **)
                                     __ckd_calloc__(local_60,8,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x443);
                          piVar16 = (int32 *)__ckd_calloc__(uVar18,4,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                  ,0x444);
                          prune_quests(sroot,(int32)local_50);
                          local_138 = ppiVar15;
                          local_b8 = piVar16;
                          uVar25 = get_quests(sroot,ppiVar15,piVar16,0,0);
                          free_tree(sroot);
                          pFVar9 = fopen(local_a8,"a");
                          local_a0 = (uint32 *)CONCAT44(local_a0._4_4_,uVar25);
                          if ((int)uVar25 < 1) {
                            uVar25 = 0;
                          }
                          local_c0 = (uint32 *)(ulong)uVar25;
                          for (puVar30 = (uint32 *)0x0; puVar30 != local_c0;
                              puVar30 = (uint32 *)((long)puVar30 + 1)) {
                            if (uVar20 < local_c8) {
                              pcVar8 = "QUESTION%d_%d_R ";
LAB_001053cc:
                              fprintf(pFVar9,pcVar8,uVar20 & 0xffffffff,(ulong)puVar30 & 0xffffffff)
                              ;
                            }
                            else {
                              if (uVar20 != local_c8) {
                                pcVar8 = "QUESTION%d_%d_L ";
                                goto LAB_001053cc;
                              }
                              fprintf(pFVar9,"QUESTION%d ",(ulong)puVar30 & 0xffffffff);
                            }
                            for (lVar19 = 0; lVar19 < local_b8[(long)puVar30]; lVar19 = lVar19 + 1)
                            {
                              fprintf(pFVar9," %s",
                                      *(undefined8 *)
                                       ((long)local_f0 + (long)local_138[(long)puVar30][lVar19] * 8)
                                     );
                            }
                            fputc(10,pFVar9);
                          }
                          fclose(pFVar9);
                          err_msg(ERR_INFO,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                  ,0x455,"Done building questions using state %d\n",
                                  uVar20 & 0xffffffff);
                          err_msg(ERR_INFO,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                  ,0x456," %d questions from state %d\n",
                                  (ulong)local_a0 & 0xffffffff,uVar20 & 0xffffffff);
                          uVar18 = local_58;
                          for (puVar30 = (uint32 *)0x0; local_c0 != puVar30;
                              puVar30 = (uint32 *)((long)puVar30 + 1)) {
                            ckd_free(local_138[(long)puVar30]);
                          }
                          ckd_free(local_138);
                          ckd_free(local_b8);
                          uVar20 = uVar20 + 1;
                        } while( true );
                      }
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x37d,"N-Feat = %d! N-Feat > 1 not implemented yet..\n");
                    }
                    else {
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x37a,"Total no. of states %d in var file != %d in mean file\n",
                              (ulong)t_nstates);
                    }
                    goto LAB_00105526;
                  }
                  if (t_veclen[uVar20] != l_veclen[uVar20]) {
                    err_msg(ERR_FATAL,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                            ,0x378,
                            "Feature length %d in var file != %d in mean file for feature %d\n",
                            (ulong)t_veclen[uVar20],(ulong)l_veclen[uVar20],uVar20);
                    goto LAB_00105526;
                  }
                  uVar20 = uVar20 + 1;
                } while( true );
              }
              iVar5 = s3gau_read(pcVar8,&fullvar,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
              if (iVar5 == 0) goto LAB_00104bcb;
              pcVar7 = cmd_ln_get();
              pcVar8 = cmd_ln_str_r(pcVar7,"-varfn");
              pcVar17 = "Error reading var file %s\n";
              lVar19 = 0x372;
              goto LAB_001056c0;
            }
          }
          pcVar8 = "Initialization failed\n";
          lVar19 = 0x421;
        }
        goto LAB_001048f8;
      }
      pcVar17 = "Unable to open %s for writing!\n";
      lVar19 = 0x413;
      pcVar8 = local_a8;
    }
    else {
      iVar5 = strcmp(pcVar8,".semi.");
      local_70 = 0;
      if (iVar5 == 0) goto LAB_001046bc;
      pcVar17 = "Unknown type %s, either \".cont.\" or \".semi.\"\n";
      lVar19 = 0x406;
    }
LAB_001056c0:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
            ,lVar19,pcVar17,pcVar8);
    goto LAB_00105526;
  }
  pcVar8 = "-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n";
  lVar19 = 0x3fd;
  goto LAB_001048f8;
code_r0x001048d4:
  uVar11 = (ulong)uVar22;
  uVar22 = uVar22 + 1;
  if (mdef->defn[uVar11].n_state != uVar1) goto code_r0x001048e2;
  goto LAB_001048d0;
code_r0x001048e2:
  pcVar8 = "Models do not have uniform topology\n";
  lVar19 = 0x33b;
LAB_001048f8:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
          ,lVar19,pcVar8);
LAB_00105526:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    float32 ****mixw = NULL,***lmixw = NULL;
    float32 ***means = NULL, **lmeans = NULL;
    float32 ***vars = NULL, **lvars = NULL;
    uint32 veclen = 0;
    uint32 n_model = 0;
    uint32 n_state = 0;
    uint32 n_feat = 0;
    uint32 n_density = 0;
    uint32 state;
    uint32 npermute, nquests_per_state;
    int32 i, j, k, continuous, **questarr, *nquestphone, nquests=0;
    int32  *phoneids,nphones;
    char   **phone_list = NULL;
    const char   *outfile;
    node   *root;
    FILE   *fp;
    const char* type;

    parse_cmd_ln(argc, argv);

    type = cmd_ln_str("-type");
    
    if(type==NULL){
      E_FATAL("-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n");
    }

    continuous = -1;
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else if (strcmp(type,".semi.") == 0) 
        continuous = 0;
    else{
      E_FATAL("Unknown type %s, either \".cont.\" or \".semi.\"\n", type);
    }
      
    if(continuous ==-1){
      E_FATAL("-type is not set correctly\n");
    }

    outfile = cmd_ln_str("-questfn");
    npermute = cmd_ln_int32("-npermute");
    nquests_per_state = cmd_ln_int32("-qstperstt");

    /* Test and cleanup outfile */
    if ((fp = fopen(outfile,"w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",outfile);
    fprintf(fp,"WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n");
    fclose(fp);

    if (init(&mixw,
             &means,
             &vars,
             &veclen,
	     &n_model,
	     &n_state,
	     &n_feat,
             &n_density,
	     &phone_list,
	     continuous) != S3_SUCCESS) {
	E_FATAL("Initialization failed\n");
    }

    for (state = 0; state < n_state; state++){
        phoneids = (int32 *) ckd_calloc(n_model,sizeof(int32));
        root = (node *) ckd_calloc(1,sizeof(node));
        nphones = n_model;
        lmixw = (float32 ***)ckd_calloc_3d(n_model,n_feat,n_density,sizeof(float32));
        if (continuous) {
            lmeans = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            lvars = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                lmixw[i][0][0] = mixw[i][state][0][0];
                for (j=0;j<veclen;j++){
                    lmeans[i][j] = means[i][state][j];
                    lvars[i][j] = vars[i][state][j];
                }
            }
        }
        else {
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                for (j=0;j<n_feat;j++)
                    for (k=0;k<n_density;k++)
                        lmixw[i][j][k] = mixw[i][state][j][k];
            }
        }
        root = make_tree(lmeans,lvars,lmixw,phoneids,nphones,n_density,n_feat,veclen,npermute,0, continuous);
        if (continuous) {
            ckd_free_2d((void **)lmeans); ckd_free_2d((void **)lvars); 
        }
        ckd_free_3d((void ***)lmixw); ckd_free((void *)phoneids);

        questarr = (int32 **)ckd_calloc(n_state*n_model,sizeof(int32 *));
        nquestphone = (int32 *)ckd_calloc(n_state*n_model,sizeof(int32));

        prune_quests(root,nquests_per_state);
        nquests = get_quests(root,questarr,nquestphone,0,0);

        free_tree(root);

        fp = fopen(outfile,"a");
        for (i=0;i<nquests;i++){
            if (state < n_state/2) fprintf(fp,"QUESTION%d_%d_R ",state,i);
            else if (state == n_state/2) fprintf(fp,"QUESTION%d ",i);
            else fprintf(fp,"QUESTION%d_%d_L ",state,i);
            for (j=0;j<nquestphone[i];j++) 
                fprintf(fp," %s",phone_list[questarr[i][j]]);
            fprintf(fp,"\n");
        }
        fclose(fp);
        E_INFO("Done building questions using state %d\n",state);
        E_INFO(" %d questions from state %d\n",nquests,state);
        for(i=0;i<nquests;i++) ckd_free((void *)questarr[i]);
        ckd_free((void **)questarr);
        ckd_free((void *)nquestphone);
    }
    E_INFO ("Stored questions in %s\n",outfile);
    return 0;
}